

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O1

uint crnlib::dxt5_block::get_block_values8(color_quad_u8 *pDst,uint l,uint h)

{
  (pDst->field_0).field_0.a = (uchar)l;
  pDst[1].field_0.field_0.a = (uchar)h;
  pDst[2].field_0.field_0.a = (uchar)((h + l * 6) / 7);
  pDst[3].field_0.field_0.a = (uchar)((l * 5 + h * 2) / 7);
  pDst[4].field_0.field_0.a = (uchar)((h * 3 + l * 4) / 7);
  pDst[5].field_0.field_0.a = (uchar)((l * 3 + h * 4) / 7);
  pDst[6].field_0.field_0.a = (uchar)((h * 5 + l * 2) / 7);
  pDst[7].field_0.field_0.a = (uchar)((l + h * 6) / 7);
  return 8;
}

Assistant:

uint dxt5_block::get_block_values8(color_quad_u8* pDst, uint l, uint h)
    {
        pDst[0].a = static_cast<uint8>(l);
        pDst[1].a = static_cast<uint8>(h);
        pDst[2].a = static_cast<uint8>((l * 6 + h) / 7);
        pDst[3].a = static_cast<uint8>((l * 5 + h * 2) / 7);
        pDst[4].a = static_cast<uint8>((l * 4 + h * 3) / 7);
        pDst[5].a = static_cast<uint8>((l * 3 + h * 4) / 7);
        pDst[6].a = static_cast<uint8>((l * 2 + h * 5) / 7);
        pDst[7].a = static_cast<uint8>((l + h * 6) / 7);
        return 8;
    }